

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

bool __thiscall CsvModelSerialiser::saveModel(CsvModelSerialiser *this,QIODevice *destination)

{
  QFlags<QIODeviceBase::OpenModeFlag> QVar1;
  ulong uVar2;
  CsvModelSerialiserPrivate *this_00;
  QTextStream local_40 [8];
  QTextStream writer;
  CsvModelSerialiserPrivate *d;
  QIODevice *destination_local;
  CsvModelSerialiser *this_local;
  
  if (destination == (QIODevice *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = QIODevice::isOpen();
    if ((uVar2 & 1) == 0) {
      QVar1 = operator|(WriteOnly,Text);
      uVar2 = (**(code **)(*(long *)destination + 0x68))(destination,QVar1.i);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    uVar2 = QIODevice::isWritable();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = d_func(this);
      if ((this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate
          .super_AbstractModelSerialiserPrivate.m_constModel == (QAbstractItemModel *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        QIODevice::setTextModeEnabled(SUB81(destination,0));
        QTextStream::QTextStream(local_40,destination);
        this_local._7_1_ = CsvModelSerialiserPrivate::writeCsv(this_00,local_40);
        QTextStream::~QTextStream(local_40);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CsvModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    if (!destination->isOpen()) {
        if (!destination->open(QIODevice::WriteOnly | QIODevice::Text))
            return false;
    }
    if (!destination->isWritable())
        return false;
    Q_D(const CsvModelSerialiser);

    if (!d->m_constModel)
        return false;
    destination->setTextModeEnabled(true);
    QTextStream writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeCsv(writer);
}